

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O3

int fits_clean_url(char *inURL,char *outURL,int *status)

{
  uint uVar1;
  grp_stack_item_struct *__ptr;
  grp_stack_item_struct *pgVar2;
  grp_stack_item_struct *pgVar3;
  grp_stack *mystack_00;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  grp_stack_data data;
  size_t sVar7;
  size_t sVar8;
  grp_stack *mystack;
  grp_stack *local_38;
  
  uVar1 = *status;
  local_38 = (grp_stack *)(ulong)uVar1;
  if (uVar1 != 0) {
    return uVar1;
  }
  mystack_00 = (grp_stack *)calloc(1,0x10);
  *outURL = '\0';
  local_38 = mystack_00;
  pcVar4 = strstr(inURL,"://");
  pcVar5 = inURL;
  if (pcVar4 != (char *)0x0) {
    pcVar5 = strchr(pcVar4 + 3,0x2f);
    if (pcVar5 == (char *)0x0) {
      strcpy(outURL,inURL);
      goto LAB_001bb8d7;
    }
    strncpy(outURL,inURL,(long)pcVar5 - (long)inURL);
    outURL[(long)pcVar5 - (long)inURL] = '\0';
  }
  if (*pcVar5 == '/') {
    sVar6 = strlen(outURL);
    (outURL + sVar6)[0] = '/';
    (outURL + sVar6)[1] = '\0';
  }
  data = strtok(pcVar5,"/");
  while (data != (grp_stack_data)0x0) {
    if (*data == '.') {
      if ((data[1] == '.') && (data[2] == '\0')) {
        if (mystack_00->stack_size == 0) {
          if (*pcVar5 != '/') goto LAB_001bb7f3;
        }
        else {
          pop_grp_stack(mystack_00);
        }
      }
      else if (data[1] != '\0') goto LAB_001bb7f3;
    }
    else {
LAB_001bb7f3:
      push_grp_stack(mystack_00,data);
    }
    data = strtok((char *)0x0,"/");
  }
  sVar8 = mystack_00->stack_size;
  while (sVar8 != 0) {
    __ptr = mystack_00->top->next;
    pcVar5 = __ptr->data;
    pgVar2 = __ptr->next;
    pgVar3 = __ptr->prev;
    pgVar3->next = pgVar2;
    pgVar2->prev = pgVar3;
    free(__ptr);
    sVar8 = mystack_00->stack_size - 1;
    mystack_00->stack_size = sVar8;
    if (sVar8 == 0) {
      mystack_00->top = (grp_stack_item *)0x0;
    }
    sVar6 = strlen(outURL);
    sVar7 = strlen(pcVar5);
    if ((sVar7 + sVar6) - 0x400 < 0xfffffffffffffbff) {
      *outURL = '\0';
      ffpmsg("outURL is too long (fits_clean_url)");
      *status = 0x7d;
      goto LAB_001bb8d7;
    }
    strcat(outURL,pcVar5);
    sVar6 = strlen(outURL);
    (outURL + sVar6)[0] = '/';
    (outURL + sVar6)[1] = '\0';
  }
  sVar6 = strlen(outURL);
  outURL[sVar6 - 1] = '\0';
LAB_001bb8d7:
  delete_grp_stack(&local_38);
  return *status;
}

Assistant:

int fits_clean_url(char *inURL,  /* I input URL string                      */
		   char *outURL, /* O output URL string                     */
		   int  *status)
/*
  clean the URL by eliminating any ".." or "." specifiers in the inURL
  string, and write the output to the outURL string.

  Note that this function must have a valid Unix-style URL as input; platform
  dependent path strings are not allowed.
 */
{
  grp_stack* mystack; /* stack to hold pieces of URL */
  char* tmp;
  char *saveptr;

  if(*status) return *status;

  mystack = new_grp_stack();
  *outURL = 0;

  do {
    /* handle URL scheme and domain if they exist */
    tmp = strstr(inURL, "://");
    if(tmp) {
      /* there is a URL scheme, so look for the end of the domain too */
      tmp = strchr(tmp + 3, '/');
      if(tmp) {
        /* tmp is now the end of the domain, so
         * copy URL scheme and domain as is, and terminate by hand */
        size_t string_size = (size_t) (tmp - inURL);
        strncpy(outURL, inURL, string_size);
        outURL[string_size] = 0;

        /* now advance the input pointer to just after the domain and go on */
        inURL = tmp;
      } else {
        /* '/' was not found, which means there are no path-like
         * portions, so copy whole inURL to outURL and we're done */
        strcpy(outURL, inURL);
        continue; /* while(0) */
      }
    }

    /* explicitly copy a leading / (absolute path) */
    if('/' == *inURL) strcat(outURL, "/");

    /* now clean the remainder of the inURL. push URL segments onto
     * stack, dealing with .. and . as we go */
    tmp = ffstrtok(inURL, "/",&saveptr); /* finds first / */
    while(tmp) {
      if(!strcmp(tmp, "..")) {
        /* discard previous URL segment, if there was one. if not,
         * add the .. to the stack if this is *not* an absolute path
         * (for absolute paths, leading .. has no effect, so skip it) */
        if(0 < mystack->stack_size) pop_grp_stack(mystack);
        else if('/' != *inURL) push_grp_stack(mystack, tmp);
      } else {
        /* always just skip ., but otherwise add segment to stack */
        if(strcmp(tmp, ".")) push_grp_stack(mystack, tmp);
      }
      tmp = ffstrtok(NULL, "/",&saveptr); /* get the next segment */
    }

    /* stack now has pieces of cleaned URL, so just catenate them
     * onto output string until stack is empty */
    while(0 < mystack->stack_size) {
      tmp = shift_grp_stack(mystack);
      if (strlen(outURL) + strlen(tmp) + 1 > FLEN_FILENAME-1)
      {
         outURL[0]=0;
         ffpmsg("outURL is too long (fits_clean_url)");
         *status = URL_PARSE_ERROR;
         delete_grp_stack(&mystack);
         return *status;         
      }
      strcat(outURL, tmp);
      strcat(outURL, "/");
    }
    outURL[strlen(outURL) - 1] = 0; /* blank out trailing / */
  } while(0);
  delete_grp_stack(&mystack);
  return *status;
}